

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMK.cpp
# Opt level: O3

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::DMK::get_track_at_position(DMK *this,Address address)

{
  FileHolder *this_00;
  byte bVar1;
  FILE FVar2;
  _func_int **pp_Var3;
  Address AVar4;
  undefined8 uVar5;
  DMK *pDVar6;
  uint16_t uVar7;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  __nlink_t _Var9;
  pointer __old_p_1;
  PCMTrack *pPVar10;
  long lVar11;
  __nlink_t _Var12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  pointer __old_p;
  PCMTrack *pPVar21;
  shared_ptr<Storage::Disk::Track> sVar22;
  uint8_t header [6];
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  uint16_t idam_locations [64];
  byte local_12a;
  undefined1 local_129;
  undefined8 local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_120 [2];
  Address local_110;
  ulong local_108;
  FILE *local_100;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  __dev_t local_d8;
  __nlink_t local_c8;
  DMK *local_c0;
  uint16_t auStack_b8 [68];
  
  this_00 = (FileHolder *)((long)address + 8);
  _Var9 = 0;
  local_110 = address;
  FileHolder::seek(this_00,(long)((int)((long)in_RDX >> 0x22) +
                                 *(int *)((long)address + 0xf8) * (int)in_RDX) *
                           *(long *)((long)address + 0x100) + 0x10,0);
  lVar18 = 0x40;
  do {
    uVar7 = FileHolder::get16le(this_00);
    AVar4 = local_110;
    auStack_b8[_Var9] = uVar7;
    _Var9 = (_Var9 + 1) - (ulong)((uVar7 & 0x7f80) == 0);
    lVar18 = lVar18 + -1;
  } while (lVar18 != 0);
  FileHolder::read((FileHolder *)&local_100,(int)this_00,
                   (void *)(*(long *)((long)local_110 + 0x100) + -0x80),(size_t)address);
  local_12a = *(byte *)((long)AVar4 + 0x108);
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ = 0;
  local_d8 = 0;
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::emplace_back<>
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &local_e8);
  local_12a = local_12a ^ 1;
  anon_unknown.dwarf_1202d73::new_encoder
            ((anon_unknown_dwarf_1202d73 *)&local_128,(PCMSegment *)(local_e8._8_8_ + -0x58),
             (bool)local_12a);
  uVar16 = *(long *)((long)local_110 + 0x100) - 0x80;
  pPVar21 = local_128;
  local_c0 = this;
  if (uVar16 != 0) {
    uVar19 = 0;
    _Var12 = 0;
    local_108 = uVar16;
    do {
      uVar15 = uVar16;
      if (_Var12 != _Var9) {
        uVar15 = (ulong)(auStack_b8[_Var12] & 0x7fff) - 0x80;
      }
      pPVar10 = pPVar21;
      local_c8 = _Var12;
      if (((local_12a & 1) == 0) && (*(char *)((long)local_110 + 0x108) == '\0')) {
        std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
        emplace_back<>((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                        *)&local_e8);
        uVar5 = local_e8._8_8_;
        Encodings::MFM::GetMFMEncoder
                  ((MFM *)&local_128,(vector<bool,_std::allocator<bool>_> *)(local_e8._8_8_ + -0x50)
                   ,(vector<bool,_std::allocator<bool>_> *)0x0);
        pPVar10 = local_128;
        *(undefined8 *)(uVar5 + -0x58) = 0x186a000000001;
        local_12a = 1;
        uVar16 = local_108;
        if (pPVar21 != (PCMTrack *)0x0) {
          (*(pPVar21->super_Track)._vptr_Track[1])(pPVar21);
          uVar16 = local_108;
        }
      }
      uVar20 = uVar19;
      if (uVar19 < uVar15) {
        do {
          (*(pPVar10->super_Track)._vptr_Track[3])(pPVar10,(ulong)(byte)local_100[uVar19],0);
          uVar19 = uVar19 + 1;
          uVar20 = uVar15;
        } while (uVar15 != uVar19);
      }
      pPVar21 = pPVar10;
      if (uVar15 == uVar16) break;
      bVar1 = (byte)(auStack_b8[local_c8] >> 8);
      bVar13 = bVar1 >> 7;
      if (auStack_b8[local_c8] >> 0xf != (ushort)(local_12a & 1)) {
        std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
        emplace_back<>((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                        *)&local_e8);
        anon_unknown.dwarf_1202d73::new_encoder
                  ((anon_unknown_dwarf_1202d73 *)&local_128,(PCMSegment *)(local_e8._8_8_ + -0x58),
                   (bool)(bVar1 >> 7));
        pPVar21 = local_128;
        local_128 = (PCMTrack *)0x0;
        local_12a = bVar13;
        if ((pPVar10 != (PCMTrack *)0x0) &&
           ((*(pPVar10->super_Track)._vptr_Track[1])(pPVar10), local_128 != (PCMTrack *)0x0)) {
          (*(local_128->super_Track)._vptr_Track[1])();
        }
      }
      bVar1 = *(byte *)((long)local_110 + 0x108);
      (*(pPVar21->super_Track)._vptr_Track[5])(pPVar21);
      lVar11 = 2 - (ulong)((bVar1 | local_12a) & 1);
      lVar18 = uVar20 + lVar11;
      lVar17 = 0;
      uVar16 = lVar11 * 3 + uVar20;
      do {
        uVar19 = uVar16;
        (*(pPVar21->super_Track)._vptr_Track[3])(pPVar21,(ulong)(byte)local_100[lVar18],0);
        *(FILE *)((long)&local_128 + lVar17) = local_100[lVar18];
        lVar17 = lVar17 + 1;
        lVar18 = lVar18 + lVar11;
        uVar16 = uVar19 + lVar11;
      } while (lVar17 != 6);
      while( true ) {
        FVar2 = local_100[lVar18];
        pp_Var3 = (pPVar21->super_Track)._vptr_Track;
        if (FVar2 == (FILE)0xfb) break;
        if (FVar2 == (FILE)0xf8) {
          lVar18 = 0x38;
          goto LAB_004307de;
        }
        lVar18 = lVar18 + lVar11;
        uVar19 = uVar19 + lVar11;
        (*pp_Var3[3])(pPVar21,(ulong)(byte)FVar2,0);
      }
      lVar18 = 0x30;
LAB_004307de:
      (**(code **)((long)pp_Var3 + lVar18))(pPVar21);
      uVar16 = local_108;
      (*(pPVar21->super_Track)._vptr_Track[6])(pPVar21);
      uVar14 = 0x80 << (local_128._3_1_ & 0x1f) | 2;
      do {
        (*(pPVar21->super_Track)._vptr_Track[3])(pPVar21,(ulong)(byte)local_100[uVar19],0);
        uVar19 = uVar19 + lVar11;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
      _Var12 = local_c8 + 1;
    } while (uVar19 < uVar16);
  }
  local_128 = (PCMTrack *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
            (a_Stack_120,(PCMTrack **)&local_128,(allocator<Storage::Disk::PCMTrack> *)&local_129,
             (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &local_e8);
  pDVar6 = local_c0;
  *(undefined4 *)&(local_c0->super_DiskImage)._vptr_DiskImage = (undefined4)local_128;
  *(undefined4 *)((long)&(local_c0->super_DiskImage)._vptr_DiskImage + 4) = local_128._4_4_;
  *(undefined4 *)&(local_c0->file_).file_ = a_Stack_120[0]._M_pi._0_4_;
  *(undefined4 *)((long)&(local_c0->file_).file_ + 4) = a_Stack_120[0]._M_pi._4_4_;
  if (pPVar21 != (PCMTrack *)0x0) {
    (*(pPVar21->super_Track)._vptr_Track[1])(pPVar21);
  }
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &local_e8);
  _Var8._M_pi = extraout_RDX;
  if (local_100 != (FILE *)0x0) {
    operator_delete(local_100,local_f0 - (long)local_100);
    _Var8._M_pi = extraout_RDX_00;
  }
  sVar22.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar22.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pDVar6;
  return (shared_ptr<Storage::Disk::Track>)
         sVar22.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> DMK::get_track_at_position(::Storage::Disk::Track::Address address) {
	file_.seek(get_file_offset_for_position(address), SEEK_SET);

	// Read the IDAM table.
	uint16_t idam_locations[64];
	std::size_t idam_count = 0;
	for(std::size_t c = 0; c < sizeof(idam_locations) / sizeof(*idam_locations); ++c) {
		idam_locations[idam_count] = file_.get16le();
		if((idam_locations[idam_count] & 0x7fff) >= 128) {
			idam_count++;
		}
	}

	// Grab the rest of the track.
	std::vector<uint8_t> track = file_.read(size_t(track_length_ - 0x80));

	// Default to outputting double density unless the disk doesn't support it.
	bool is_double_density = !is_purely_single_density_;
	std::vector<PCMSegment> segments;
	std::unique_ptr<Encodings::MFM::Encoder> encoder;
	segments.emplace_back();
	encoder = new_encoder(segments.back(), is_double_density);

	std::size_t idam_pointer = 0;

	const std::size_t track_length = size_t(track_length_) - 0x80;
	std::size_t track_pointer = 0;
	while(track_pointer < track_length) {
		// Determine bytes left until next IDAM.
		std::size_t destination;
		if(idam_pointer != idam_count) {
			destination = (idam_locations[idam_pointer] & 0x7fff) - 0x80;
		} else {
			destination = track_length;
		}

		// Output every intermediate byte.
		if(!is_double_density && !is_purely_single_density_) {
			is_double_density = true;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}
		while(track_pointer < destination) {
			encoder->add_byte(track[track_pointer]);
			track_pointer++;
		}

		// Exit now if that's it.
		if(destination == track_length) break;

		// Being now located at the IDAM, check for a change of encoding.
		bool next_is_double_density = !!(idam_locations[idam_pointer] & 0x8000);
		if(next_is_double_density != is_double_density) {
			is_double_density = next_is_double_density;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}

		// Now at the IDAM, which will always be an FE regardless of FM/MFM encoding,
		// presumably through misunderstanding of the designer? Write out a real IDAM
		// for the current density, then the rest of the ID: four bytes for the address
		// plus two for the CRC. Keep a copy of the header while we're here, so that the
		// size of the sector is known momentarily.
		std::size_t step_rate = (!is_double_density && !is_purely_single_density_) ? 2 : 1;
		encoder->add_ID_address_mark();
		uint8_t header[6];
		for(int c = 0; c < 6; ++c) {
			track_pointer += step_rate;
			encoder->add_byte(track[track_pointer]);
			header[c] = track[track_pointer];
		}
		track_pointer += step_rate;

		// Now write out as many bytes as are found prior to an FB or F8 (same comment as
		// above: those are the FM-esque marks, but it seems as though transcription to MFM
		// is implicit).
		while(true) {
			uint8_t next_byte = track[track_pointer];
			track_pointer += step_rate;
			if(next_byte == 0xfb || next_byte == 0xf8) {
				// Write a data or deleted data address mark.
				if(next_byte == 0xfb) encoder->add_data_address_mark();
				else encoder->add_deleted_data_address_mark();
				break;
			}
			encoder->add_byte(next_byte);
		}

		// Now write out a data mark (the file format appears to leave these implicit?),
		// then the sector contents plus the CRC.
		encoder->add_data_address_mark();
		int sector_size = 2 + (128 << header[3]);
		while(sector_size--) {
			encoder->add_byte(track[track_pointer]);
			track_pointer += step_rate;
		}

		idam_pointer++;
	}

	return std::make_shared<PCMTrack>(segments);
}